

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v8::detail::
    get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
              (void)

{
  undefined1 value [16];
  char *message;
  int iStack0000000000000008;
  undefined4 in_stack_00000018;
  undefined8 in_stack_fffffffffffffff0;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 =
         width_checker<fmt::v8::detail::error_handler>::operator()<int,_0>
                   ((width_checker<fmt::v8::detail::error_handler> *)&stack0xffffffffffffffe8,
                    iStack0000000000000008);
    break;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    break;
  case 3:
    _iStack0000000000000008 =
         width_checker<fmt::v8::detail::error_handler>::operator()<long_long,_0>
                   ((width_checker<fmt::v8::detail::error_handler> *)&stack0xffffffffffffffe8,
                    _iStack0000000000000008);
    break;
  case 4:
  case 6:
    break;
  case 5:
    value._8_8_ = in_stack_fffffffffffffff0;
    value._0_8_ = &stack0xfffffffffffffff7;
    _iStack0000000000000008 =
         width_checker<fmt::v8::detail::error_handler>::operator()<__int128,_0>
                   ((width_checker<fmt::v8::detail::error_handler> *)&stack0xffffffffffffffe8,
                    (__int128)value);
    break;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    message = "width is not integer";
    goto LAB_00127636;
  default:
    _iStack0000000000000008 =
         width_checker<fmt::v8::detail::error_handler>::operator()<fmt::v8::monostate,_0>
                   ((width_checker<fmt::v8::detail::error_handler> *)&stack0xffffffffffffffe8);
  }
  if (_iStack0000000000000008 >> 0x1f == 0) {
    return (int)_iStack0000000000000008;
  }
  message = "number is too big";
LAB_00127636:
  error_handler::on_error((error_handler *)&stack0xfffffffffffffff7,message);
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}